

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O0

void do_weighting<dense_parameters>
               (vw *all,uint64_t length,float *local_weights,dense_parameters *weights)

{
  uint32_t uVar1;
  weight *pwVar2;
  dense_parameters *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  float fVar3;
  float ratio;
  float *weight;
  uint64_t i;
  ulong local_28;
  
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    uVar1 = dense_parameters::stride_shift(in_RCX);
    pwVar2 = dense_parameters::operator[](in_RCX,local_28 << ((byte)uVar1 & 0x3f));
    if (*(float *)(in_RDX + local_28 * 4) <= 0.0) {
      *(undefined4 *)(in_RDX + local_28 * 4) = 0;
      *pwVar2 = 0.0;
    }
    else {
      fVar3 = pwVar2[1] / *(float *)(in_RDX + local_28 * 4);
      *(float *)(in_RDX + local_28 * 4) = *pwVar2 * fVar3;
      *pwVar2 = fVar3 * *pwVar2;
      pwVar2[1] = fVar3 * pwVar2[1];
      if ((*(byte *)(in_RDI + 0x343d) & 1) != 0) {
        pwVar2[*(long *)(in_RDI + 0x3470)] = fVar3 * pwVar2[*(long *)(in_RDI + 0x3470)];
      }
    }
  }
  return;
}

Assistant:

void do_weighting(vw& all, uint64_t length, float* local_weights, T& weights)
{
  for (uint64_t i = 0; i < length; i++)
  {
    float* weight = &weights[i << weights.stride_shift()];
    if (local_weights[i] > 0)
    {
      float ratio = weight[1] / local_weights[i];
      local_weights[i] = weight[0] * ratio;
      weight[0] *= ratio;
      weight[1] *= ratio;  // A crude max
      if (all.normalized_updates)
        weight[all.normalized_idx] *= ratio;  // A crude max
    }
    else
    {
      local_weights[i] = 0;
      *weight = 0;
    }
  }
}